

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall FMapInfoParser::ParseDamageDefinition(FMapInfoParser *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  FName damageType;
  double local_50;
  FName local_44;
  DamageTypeDefinition local_40;
  
  FScanner::MustGetString(&this->sc);
  FName::FName(&damageType,(this->sc).String);
  ParseOpenBrace(this);
  local_50 = 1.0;
  bVar3 = false;
  bVar4 = false;
  while (bVar2 = bVar4, FScanner::MustGetAnyToken(&this->sc), (this->sc).TokenType != 0x7d) {
    bVar1 = FScanner::Compare(&this->sc,"FACTOR");
    bVar4 = bVar2;
    if (bVar1) {
      FScanner::MustGetStringName(&this->sc,"=");
      FScanner::MustGetFloat(&this->sc);
      local_50 = (this->sc).Float;
      bVar4 = true;
      if (local_50 != 0.0) {
        bVar4 = bVar2;
      }
      if (NAN(local_50)) {
        bVar4 = bVar2;
      }
    }
    else {
      bVar2 = FScanner::Compare(&this->sc,"REPLACEFACTOR");
      if (bVar2) {
        bVar4 = true;
      }
      else {
        bVar2 = FScanner::Compare(&this->sc,"NOARMOR");
        if (bVar2) {
          bVar3 = true;
        }
        else {
          FScanner::ScriptError
                    (&this->sc,"Unexpected data (%s) in damagetype definition.",(this->sc).String);
        }
      }
    }
  }
  local_40.DefaultFactor = local_50;
  local_44.Index = damageType.Index;
  local_40.ReplaceFactor = bVar2;
  local_40.NoArmor = bVar3;
  DamageTypeDefinition::Apply(&local_40,&local_44);
  return;
}

Assistant:

void FMapInfoParser::ParseDamageDefinition()
{
	sc.MustGetString();
	FName damageType = sc.String;

	DamageTypeDefinition dtd;

	ParseOpenBrace();
	while (sc.MustGetAnyToken(), sc.TokenType != '}')
	{
		if (sc.Compare("FACTOR"))
		{
			sc.MustGetStringName("=");
			sc.MustGetFloat();
			dtd.DefaultFactor = sc.Float;
			if (dtd.DefaultFactor == 0) dtd.ReplaceFactor = true;
		}
		else if (sc.Compare("REPLACEFACTOR"))
		{
			dtd.ReplaceFactor = true;
		}
		else if (sc.Compare("NOARMOR"))
		{
			dtd.NoArmor = true;
		}
		else
		{
			sc.ScriptError("Unexpected data (%s) in damagetype definition.", sc.String);
		}
	}

	dtd.Apply(damageType);
}